

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CollectiveDipoleDisplacement.cpp
# Opt level: O2

Vector3d * __thiscall
OpenMD::CollectiveDipoleDisplacement::calcCorrVal
          (Vector3d *__return_storage_ptr__,CollectiveDipoleDisplacement *this,int frame1,int frame2
          )

{
  pointer pVVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  Vector3d diff;
  Vector<double,_3U> local_60;
  Vector<double,_3U> local_48;
  
  Vector<double,_3U>::Vector(&local_48);
  pVVar1 = (this->CRcm_).
           super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  operator-(&local_60,&pVVar1[frame2].super_Vector<double,_3U>,
            &pVVar1[frame1].super_Vector<double,_3U>);
  Vector3<double>::operator=((Vector3<double> *)&local_48,&local_60);
  dVar2 = Vector<double,_3U>::lengthSquare(&local_48);
  pVVar1 = (this->CRtot_).
           super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  operator-(&local_60,&pVVar1[frame2].super_Vector<double,_3U>,
            &pVVar1[frame1].super_Vector<double,_3U>);
  Vector3<double>::operator=((Vector3<double> *)&local_48,&local_60);
  dVar3 = Vector<double,_3U>::lengthSquare(&local_48);
  pVVar1 = (this->CRrot_).
           super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  operator-(&local_60,&pVVar1[frame2].super_Vector<double,_3U>,
            &pVVar1[frame1].super_Vector<double,_3U>);
  Vector3<double>::operator=((Vector3<double> *)&local_48,&local_60);
  dVar4 = Vector<double,_3U>::lengthSquare(&local_48);
  Vector<double,_3U>::Vector(&__return_storage_ptr__->super_Vector<double,_3U>);
  (__return_storage_ptr__->super_Vector<double,_3U>).data_[0] = dVar2;
  (__return_storage_ptr__->super_Vector<double,_3U>).data_[1] = dVar3;
  (__return_storage_ptr__->super_Vector<double,_3U>).data_[2] = dVar4;
  return __return_storage_ptr__;
}

Assistant:

Vector3d CollectiveDipoleDisplacement::calcCorrVal(int frame1, int frame2) {
    Vector3d diff;
    RealType dcm, dtot, drot;
    diff = CRcm_[frame2] - CRcm_[frame1];
    dcm  = diff.lengthSquare();
    diff = CRtot_[frame2] - CRtot_[frame1];
    dtot = diff.lengthSquare();
    diff = CRrot_[frame2] - CRrot_[frame1];
    drot = diff.lengthSquare();

    return Vector3d(dcm, dtot, drot);
  }